

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::write4Channel<unsigned_int,2u,10u,10u,10u,30u,20u,10u,0u>
               (GLuint channel,GLdouble value,GLubyte *pixel)

{
  sbyte sVar1;
  TestError *this;
  uint t_value;
  GLdouble d_value;
  GLdouble d_max;
  uint result;
  uint *ptr;
  uint local_28;
  uint off;
  uint max;
  uint mask;
  GLubyte *pixel_local;
  GLdouble value_local;
  GLuint channel_local;
  
  switch(channel) {
  case 0:
    off = 3;
    local_28 = 3;
    sVar1 = 0x1e;
    break;
  case 1:
    off = 0x3ff;
    local_28 = 0x3ff;
    sVar1 = 0x14;
    break;
  case 2:
    off = 0x3ff;
    local_28 = 0x3ff;
    sVar1 = 10;
    break;
  case 3:
    off = 0x3ff;
    local_28 = 0x3ff;
    sVar1 = 0;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid channel",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
               ,0x8aa);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  *(uint *)pixel = ((uint)(long)(value * (double)local_28) & off) << sVar1 | *(uint *)pixel;
  return;
}

Assistant:

void write4Channel(GLuint channel, GLdouble value, GLubyte* pixel)
{
	T  mask   = 0;
	T  max	= 0;
	T  off	= 0;
	T* ptr	= (T*)pixel;
	T  result = 0;

	static const T max_1 = (1 << size_1) - 1;
	static const T max_2 = (1 << size_2) - 1;
	static const T max_3 = (1 << size_3) - 1;
	static const T max_4 = (1 << size_4) - 1;

	switch (channel)
	{
	case 0:
		mask = max_1;
		max  = max_1;
		off  = off_1;
		break;
	case 1:
		mask = max_2;
		max  = max_2;
		off  = off_2;
		break;
	case 2:
		mask = max_3;
		max  = max_3;
		off  = off_3;
		break;
	case 3:
		mask = max_4;
		max  = max_4;
		off  = off_4;
		break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}

	const GLdouble d_max   = (GLdouble)max;
	const GLdouble d_value = value * d_max;
	const T		   t_value = (T)d_value;

	result = (T)((t_value & mask) << off);

	*ptr |= result;
}